

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_vdpu1.c
# Opt level: O1

MPP_RET hal_jpegd_vdpu1_wait(void *hal,HalTaskInfo *task)

{
  uint uVar1;
  uint uVar2;
  RK_U32 *pRVar3;
  void *pvVar4;
  MPP_RET MVar5;
  void *__ptr;
  char *fmt;
  MPP_RET MVar6;
  RK_U32 RVar7;
  DecCbHalDone param;
  
  pRVar3 = *(RK_U32 **)((long)hal + 0x18);
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_VDPU1","enter\n","hal_jpegd_vdpu1_wait");
  }
  MVar6 = MPP_OK;
  if (((ulong)(task->dec).flags & 4) == 0) {
    MVar5 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),0x10,(void *)0x0);
    MVar6 = MPP_OK;
    if (MVar5 != MPP_OK) {
      *(byte *)&(task->dec).flags = *(byte *)&(task->dec).flags | 4;
      _mpp_log_l(2,"HAL_JPEGD_VDPU1","poll cmd failed %d\n","hal_jpegd_vdpu1_wait",
                 (ulong)(uint)MVar5);
      MVar6 = MVar5;
    }
  }
  if (*(long *)((long)hal + 0x88) == 0) goto LAB_00212ef3;
  uVar1 = pRVar3[1];
  param.task = task;
  param.regs = pRVar3;
  if ((uVar1 >> 0xd & 1) == 0) {
    if ((uVar1 >> 0x10 & 1) == 0) {
      if ((uVar1 >> 0x12 & 1) == 0) {
        if ((uVar1 >> 0xe & 1) == 0) {
          RVar7 = 1;
          if ((uVar1 >> 8 & 1) != 0) {
            if (((byte)jpegd_debug & 0x80) == 0) {
              RVar7 = 0;
            }
            else {
              RVar7 = 0;
              _mpp_log_l(4,"HAL_JPEGD_VDPU1","DECODE SUCCESS!",(char *)0x0);
            }
          }
          goto LAB_00212ed4;
        }
        fmt = "IRQ BUFFER EMPTY!";
      }
      else {
        fmt = "IRQ TIMEOUT!";
      }
      goto LAB_00212ebb;
    }
    RVar7 = 1;
    if (*(int *)((long)hal + 0x90) == 0) {
      _mpp_log_l(2,"HAL_JPEGD_VDPU1","IRQ STREAM ERROR! %d","hal_jpegd_vdpu1_wait",0);
    }
    else {
      MVar6 = MPP_OK;
    }
  }
  else {
    fmt = "IRQ BUS ERROR!";
LAB_00212ebb:
    _mpp_log_l(2,"HAL_JPEGD_VDPU1",fmt,"hal_jpegd_vdpu1_wait");
    RVar7 = 1;
  }
LAB_00212ed4:
  param.hard_err = RVar7;
  mpp_callback_f("hal_jpegd_vdpu1_wait",*(MppCbCtx **)((long)hal + 0x88),&param);
LAB_00212ef3:
  if (((byte)jpegd_debug & 0x10) != 0) {
    param.task = (void *)0x0;
    mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 8),(task->dec).output,SLOT_BUFFER,&param);
    __ptr = mpp_buffer_get_ptr_with_caller(param.task,"hal_jpegd_vdpu1_wait");
    snprintf(hal_jpegd_vdpu1_wait::name,0x3f,"/data/tmp/output%02d.yuv",
             (ulong)*(uint *)((long)hal + 0xa0));
    hal_jpegd_vdpu1_wait::jpg_file = (FILE *)fopen(hal_jpegd_vdpu1_wait::name,"wb+");
    if ((FILE *)hal_jpegd_vdpu1_wait::jpg_file != (FILE *)0x0) {
      pvVar4 = (task->dec).syntax.data;
      uVar1 = *(uint *)((long)pvVar4 + 0x8c8);
      uVar2 = *(uint *)((long)pvVar4 + 0x8cc);
      fwrite(__ptr,(ulong)(uVar1 * uVar2 * 3 >> 1),1,(FILE *)hal_jpegd_vdpu1_wait::jpg_file);
      if (((byte)jpegd_debug & 0x10) != 0) {
        _mpp_log_l(4,"HAL_JPEGD_VDPU1","frame_%02d output YUV(%d*%d) saving to %s\n",(char *)0x0,
                   (ulong)*(uint *)((long)hal + 0xa0),(ulong)uVar1,(ulong)uVar2,
                   hal_jpegd_vdpu1_wait::name);
      }
      fclose((FILE *)hal_jpegd_vdpu1_wait::jpg_file);
      *(int *)((long)hal + 0xa0) = *(int *)((long)hal + 0xa0) + 1;
    }
  }
  pRVar3[1] = 0;
  if (((byte)jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEGD_VDPU1","exit\n","hal_jpegd_vdpu1_wait");
  }
  return MVar6;
}

Assistant:

MPP_RET hal_jpegd_vdpu1_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    JpegdHalCtx *JpegHalCtx = (JpegdHalCtx *)hal;
    JpegRegSet *reg_out = JpegHalCtx->regs;
    RK_U32 errinfo = 1;

    jpegd_dbg_func("enter\n");
    if (task->dec.flags.parse_err)
        goto __SKIP_HARD;

    ret = mpp_dev_ioctl(JpegHalCtx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret) {
        task->dec.flags.parse_err = 1;
        mpp_err_f("poll cmd failed %d\n", ret);
    }

__SKIP_HARD:
    if (JpegHalCtx->dec_cb) {
        DecCbHalDone param;

        param.task = (void *)&task->dec;
        param.regs = (RK_U32 *)reg_out;
        if (reg_out->reg1_interrupt.sw_dec_bus_int) {
            mpp_err_f("IRQ BUS ERROR!");
        } else if (reg_out->reg1_interrupt.sw_dec_error_int) {
            /*
            * NOTE: It is a bug of VDPU1, when sample color is YUV422,
            * YUV444, YUV411, the height could be aligned with 8 but not 16
            */
            if (JpegHalCtx->output_fmt != MPP_FMT_YUV420SP)
                ret = MPP_OK;
            else
                mpp_err_f("IRQ STREAM ERROR! %d", JpegHalCtx->output_fmt);
        } else if (reg_out->reg1_interrupt.sw_dec_timeout) {
            mpp_err_f("IRQ TIMEOUT!");
        } else if (reg_out->reg1_interrupt.sw_dec_buffer_int) {
            mpp_err_f("IRQ BUFFER EMPTY!");
        } else if (reg_out->reg1_interrupt.sw_dec_irq) {
            errinfo = 0;
            jpegd_dbg_hal("DECODE SUCCESS!");
        }
        param.hard_err = errinfo;
        mpp_callback(JpegHalCtx->dec_cb, &param);
    }

    /* debug information */
    if (jpegd_debug & JPEGD_DBG_IO) {
        static FILE *jpg_file;
        static char name[64];
        MppBuffer outputBuf = NULL;
        void *base = NULL;
        mpp_buf_slot_get_prop(JpegHalCtx->frame_slots, task->dec.output,
                              SLOT_BUFFER, &outputBuf);
        base = mpp_buffer_get_ptr(outputBuf);

        snprintf(name, sizeof(name) - 1, "/data/tmp/output%02d.yuv",
                 JpegHalCtx->output_yuv_count);
        jpg_file = fopen(name, "wb+");
        if (jpg_file) {
            JpegdSyntax *s = (JpegdSyntax *)task->dec.syntax.data;
            RK_U32 width = s->hor_stride;
            RK_U32 height = s->ver_stride;

            fwrite(base, width * height * 3 / 2, 1, jpg_file);
            jpegd_dbg_io("frame_%02d output YUV(%d*%d) saving to %s\n",
                         JpegHalCtx->output_yuv_count,
                         width, height, name);

            fclose(jpg_file);
            JpegHalCtx->output_yuv_count++;
        }
    }

    memset(&reg_out->reg1_interrupt, 0, sizeof(RK_U32));
    jpegd_dbg_func("exit\n");

    return ret;
}